

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O0

bool __thiscall sf::Window::setActive(Window *this,bool active)

{
  bool bVar1;
  ostream *poVar2;
  bool active_local;
  Window *this_local;
  
  if (this->m_context == (GlContext *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = priv::GlContext::setActive(this->m_context,active);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to activate the window\'s context");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Window::setActive(bool active) const
{
    if (m_context)
    {
        if (m_context->setActive(active))
        {
            return true;
        }
        else
        {
            err() << "Failed to activate the window's context" << std::endl;
            return false;
        }
    }
    else
    {
        return false;
    }
}